

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_debug.c
# Opt level: O2

int lj_debug_getinfo(lua_State *L,char *what,lj_Debug *ar,int ext)

{
  uint uVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  BCLine BVar5;
  uint uVar6;
  char *pcVar7;
  GCtab *t;
  TValue *pTVar8;
  uint32_t uVar9;
  GCfunc *fn;
  long lVar10;
  ulong uVar11;
  char cVar12;
  int iVar13;
  ulong uVar14;
  cTValue *local_48;
  
  if (*what == '>') {
    uVar6 = L->top[-1].u32.lo;
    L->top = L->top + -1;
    what = what + 1;
    local_48 = (cTValue *)0x0;
    pTVar8 = (TValue *)0x0;
  }
  else {
    uVar6 = ar->i_ci;
    pTVar8 = (TValue *)((ulong)(L->stack).ptr32 + (ulong)(uVar6 & 0xffff) * 8);
    local_48 = (TValue *)0x0;
    if (0xffff < uVar6) {
      local_48 = pTVar8 + (uVar6 >> 0x10);
    }
    uVar6 = (pTVar8->u32).lo;
  }
  fn = (GCfunc *)(ulong)uVar6;
  bVar4 = false;
  bVar3 = false;
  do {
    cVar12 = *what;
    if (cVar12 == 'L') {
      bVar4 = true;
    }
    else if (cVar12 == 'S') {
      if ((fn->c).ffid == '\0') {
        uVar11 = (ulong)(fn->c).pc.ptr32;
        uVar1 = *(uint *)(uVar11 - 0x18);
        iVar13 = *(int *)(uVar11 - 0x14);
        ar->source = (char *)((GCstr *)(ulong)uVar1 + 1);
        lj_debug_shortname(ar->short_src,(GCstr *)(ulong)uVar1);
        ar->linedefined = iVar13;
        iVar2 = *(int *)(uVar11 - 0x10);
        ar->lastlinedefined = iVar2 + iVar13;
        pcVar7 = "main";
        if (iVar2 == 0) {
          pcVar7 = "Lua";
        }
        if (iVar13 != 0) {
          pcVar7 = "Lua";
        }
      }
      else {
        ar->source = "=[C]";
        builtin_strncpy(ar->short_src,"[C]",4);
        ar->linedefined = -1;
        ar->lastlinedefined = -1;
        pcVar7 = "C";
      }
      ar->what = pcVar7;
    }
    else if (cVar12 == 'f') {
      bVar3 = true;
    }
    else if (cVar12 == 'l') {
      BVar5 = -1;
      if (pTVar8 != (TValue *)0x0) {
        BVar5 = debug_frameline(L,fn,local_48);
      }
      ar->currentline = BVar5;
    }
    else if (cVar12 == 'n') {
      if (pTVar8 != (TValue *)0x0) {
        pcVar7 = lj_debug_funcname(L,pTVar8,&ar->name);
        ar->namewhat = pcVar7;
        if (pcVar7 != (char *)0x0) goto LAB_0010b238;
      }
      ar->namewhat = "";
      ar->name = (char *)0x0;
    }
    else {
      if (cVar12 != 'u') {
        if (cVar12 == '\0') {
          if (bVar3) {
            pTVar8 = L->top;
            (pTVar8->u32).lo = uVar6;
            (pTVar8->field_2).it = 0xfffffff7;
            pTVar8 = L->top;
            L->top = pTVar8 + 1;
            if ((TValue *)(ulong)(L->maxstack).ptr32 <= pTVar8 + 1) {
              lj_state_growstack1(L);
            }
          }
          iVar13 = 1;
          if (bVar4) {
            if ((fn->c).ffid == '\0') {
              t = lj_tab_new(L,0,0);
              uVar11 = (ulong)(fn->c).pc.ptr32;
              uVar14 = (ulong)*(uint *)(uVar11 - 0xc);
              if (uVar14 != 0) {
                iVar13 = *(int *)(uVar11 - 0x14);
                iVar2 = *(int *)(uVar11 - 0x38);
                cVar12 = '\x01';
                if (0xff < *(int *)(uVar11 - 0x10)) {
                  cVar12 = (0xffff < *(int *)(uVar11 - 0x10)) * '\x02' + '\x02';
                }
                for (uVar11 = 0; iVar2 - 1 != uVar11; uVar11 = uVar11 + 1) {
                  if (cVar12 == '\x02') {
                    uVar6 = (uint)*(ushort *)(uVar14 + uVar11 * 2);
                  }
                  else if (cVar12 == '\x01') {
                    uVar6 = (uint)*(byte *)(uVar14 + uVar11);
                  }
                  else {
                    uVar6 = *(uint *)(uVar14 + uVar11 * 4);
                  }
                  lVar10 = (long)(int)uVar6 + (long)iVar13;
                  uVar6 = (uint)lVar10;
                  if (uVar6 < t->asize) {
                    pTVar8 = (TValue *)((ulong)(t->array).ptr32 + lVar10 * 8);
                  }
                  else {
                    pTVar8 = lj_tab_setinth(L,t,uVar6);
                  }
                  (pTVar8->field_2).it = 0xfffffffd;
                }
              }
              pTVar8 = L->top;
              (pTVar8->u32).lo = (uint32_t)t;
              uVar9 = 0xfffffff4;
            }
            else {
              pTVar8 = L->top;
              uVar9 = 0xffffffff;
            }
            iVar13 = 1;
            (pTVar8->field_2).it = uVar9;
            pTVar8 = L->top;
            L->top = pTVar8 + 1;
            if ((TValue *)(ulong)(L->maxstack).ptr32 <= pTVar8 + 1) {
              lj_state_growstack1(L);
            }
          }
        }
        else {
          iVar13 = 0;
        }
        return iVar13;
      }
      ar->nups = (uint)(fn->c).nupvalues;
      if (ext != 0) {
        if ((fn->c).ffid == '\0') {
          uVar11 = (ulong)(fn->c).pc.ptr32;
          ar->nparams = (uint)*(byte *)(uVar11 - 0x3a);
          ar->isvararg = *(byte *)(uVar11 - 0x1b) >> 1 & 1;
        }
        else {
          ar->nparams = 0;
          ar->isvararg = 1;
        }
      }
    }
LAB_0010b238:
    what = what + 1;
  } while( true );
}

Assistant:

int lj_debug_getinfo(lua_State *L, const char *what, lj_Debug *ar, int ext)
{
  int opt_f = 0, opt_L = 0;
  TValue *frame = NULL;
  TValue *nextframe = NULL;
  GCfunc *fn;
  if (*what == '>') {
    TValue *func = L->top - 1;
    api_check(L, tvisfunc(func));
    fn = funcV(func);
    L->top--;
    what++;
  } else {
    uint32_t offset = (uint32_t)ar->i_ci & 0xffff;
    uint32_t size = (uint32_t)ar->i_ci >> 16;
    lua_assert(offset != 0);
    frame = tvref(L->stack) + offset;
    if (size) nextframe = frame + size;
    lua_assert(frame <= tvref(L->maxstack) &&
	       (!nextframe || nextframe <= tvref(L->maxstack)));
    fn = frame_func(frame);
    lua_assert(fn->c.gct == ~LJ_TFUNC);
  }
  for (; *what; what++) {
    if (*what == 'S') {
      if (isluafunc(fn)) {
	GCproto *pt = funcproto(fn);
	BCLine firstline = pt->firstline;
	GCstr *name = proto_chunkname(pt);
	ar->source = strdata(name);
	lj_debug_shortname(ar->short_src, name);
	ar->linedefined = (int)firstline;
	ar->lastlinedefined = (int)(firstline + pt->numline);
	ar->what = (firstline || !pt->numline) ? "Lua" : "main";
      } else {
	ar->source = "=[C]";
	ar->short_src[0] = '[';
	ar->short_src[1] = 'C';
	ar->short_src[2] = ']';
	ar->short_src[3] = '\0';
	ar->linedefined = -1;
	ar->lastlinedefined = -1;
	ar->what = "C";
      }
    } else if (*what == 'l') {
      ar->currentline = frame ? debug_frameline(L, fn, nextframe) : -1;
    } else if (*what == 'u') {
      ar->nups = fn->c.nupvalues;
      if (ext) {
	if (isluafunc(fn)) {
	  GCproto *pt = funcproto(fn);
	  ar->nparams = pt->numparams;
	  ar->isvararg = !!(pt->flags & PROTO_VARARG);
	} else {
	  ar->nparams = 0;
	  ar->isvararg = 1;
	}
      }
    } else if (*what == 'n') {
      ar->namewhat = frame ? lj_debug_funcname(L, frame, &ar->name) : NULL;
      if (ar->namewhat == NULL) {
	ar->namewhat = "";
	ar->name = NULL;
      }
    } else if (*what == 'f') {
      opt_f = 1;
    } else if (*what == 'L') {
      opt_L = 1;
    } else {
      return 0;  /* Bad option. */
    }
  }
  if (opt_f) {
    setfuncV(L, L->top, fn);
    incr_top(L);
  }
  if (opt_L) {
    if (isluafunc(fn)) {
      GCtab *t = lj_tab_new(L, 0, 0);
      GCproto *pt = funcproto(fn);
      const void *lineinfo = proto_lineinfo(pt);
      if (lineinfo) {
	BCLine first = pt->firstline;
	int sz = pt->numline < 256 ? 1 : pt->numline < 65536 ? 2 : 4;
	MSize i, szl = pt->sizebc-1;
	for (i = 0; i < szl; i++) {
	  BCLine line = first +
	    (sz == 1 ? (BCLine)((const uint8_t *)lineinfo)[i] :
	     sz == 2 ? (BCLine)((const uint16_t *)lineinfo)[i] :
	     (BCLine)((const uint32_t *)lineinfo)[i]);
	  setboolV(lj_tab_setint(L, t, line), 1);
	}
      }
      settabV(L, L->top, t);
    } else {
      setnilV(L->top);
    }
    incr_top(L);
  }
  return 1;  /* Ok. */
}